

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void av1_filter_block_plane_vert_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  byte bVar1;
  uint uVar2;
  BLOCK_SIZE *pBVar3;
  BLOCK_SIZE BVar4;
  int iVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 *in_R9;
  BLOCK_SIZE *in_stack_00000008;
  byte in_stack_00000010;
  uint32_t advance_units_1;
  int x;
  uint8_t *p;
  USE_FILTER_TYPE use_filter_type;
  TX_SIZE *tx_size;
  AV1_DEBLOCKING_PARAMETERS *params;
  int min_block_height;
  uint32_t x_end;
  uint32_t x_start;
  uint32_t curr_y;
  int y;
  ptrdiff_t mode_step;
  int x_range;
  int y_range;
  int plane_mi_rows;
  int plane_mi_cols;
  int dst_stride;
  uint8_t *dst_ptr;
  int advance_units;
  TX_SIZE prev_tx_size;
  uint32_t *counter_ptr;
  TX_SIZE *tx_size_1;
  AV1_DEBLOCKING_PARAMETERS *params_1;
  int is_vert;
  int block_dim_1;
  loop_filter_thresh *limits_1;
  int32_t pu_edge_1;
  uint8_t level_1;
  TX_SIZE pv_ts_1;
  int pv_col_1;
  int pv_row_1;
  MB_MODE_INFO *mi_prev_1;
  _Bool curr_skipped_1;
  TX_SIZE ts_1;
  MB_MODE_INFO *mbmi_1;
  MB_MODE_INFO **mi_1;
  int is_vert_2;
  TX_SIZE mb_tx_size_3;
  int blk_col_3;
  int blk_row_3;
  BLOCK_SIZE sb_type_3;
  TX_SIZE tx_size_5;
  TX_SIZE mb_tx_size_2;
  int blk_col_2;
  int blk_row_2;
  BLOCK_SIZE sb_type_2;
  TX_SIZE tx_size_4;
  int block_dim;
  loop_filter_thresh *limits;
  int32_t pu_edge;
  uint8_t level;
  TX_SIZE pv_ts;
  int pv_col;
  int pv_row;
  MB_MODE_INFO *mi_prev;
  _Bool curr_skipped;
  TX_SIZE ts;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO **mi;
  int is_vert_1;
  TX_SIZE mb_tx_size_1;
  int blk_col_1;
  int blk_row_1;
  BLOCK_SIZE sb_type_1;
  TX_SIZE tx_size_3;
  TX_SIZE mb_tx_size;
  int blk_col;
  int blk_row;
  BLOCK_SIZE sb_type;
  TX_SIZE tx_size_2;
  undefined4 in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  uint local_3c8;
  uint local_3c4;
  uint32_t in_stack_fffffffffffffc40;
  uint in_stack_fffffffffffffc44;
  uint in_stack_fffffffffffffc48;
  uint in_stack_fffffffffffffc4c;
  loop_filter_info_n *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  uint in_stack_fffffffffffffc5c;
  uint local_3a0;
  uint local_39c;
  int local_38c;
  uint local_388;
  uint local_384;
  undefined1 local_380;
  bool local_379;
  uint local_378;
  undefined4 in_stack_fffffffffffffc8c;
  SequenceHeader *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  uint in_stack_fffffffffffffc9c;
  uint local_360;
  uint in_stack_fffffffffffffca4;
  BLOCK_SIZE *in_stack_fffffffffffffca8;
  int local_340;
  int local_33c;
  int local_334;
  BLOCK_SIZE *local_320;
  undefined1 *local_318;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  uint local_2fc;
  undefined8 local_2f8;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined1 *local_2d0;
  uint local_2c8;
  int local_2c4;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  int local_2a8;
  BLOCK_SIZE local_2a1;
  uint *local_2a0;
  BLOCK_SIZE *local_298;
  undefined1 *local_290;
  int local_284;
  uint *local_280;
  long local_278;
  uint local_26c;
  long local_268;
  uint local_25c;
  uint local_258;
  char local_251;
  long local_250;
  long local_248;
  undefined1 *local_238;
  uint local_22c;
  long local_228;
  uint local_220;
  byte local_21a;
  BLOCK_SIZE local_219;
  uint local_218;
  uint local_214;
  loop_filter_info_n *local_210;
  byte local_202;
  BLOCK_SIZE local_201;
  loop_filter_info_n *local_200;
  undefined8 *local_1f8;
  uint local_1ec;
  uint *local_1e8;
  long local_1e0;
  BLOCK_SIZE local_1d6;
  byte local_1d5;
  uint local_1d4;
  long local_1d0;
  uint local_1c4;
  uint local_1c0;
  char local_1b9;
  long local_1b8;
  long local_1b0;
  BLOCK_SIZE *local_1a8;
  undefined1 *local_1a0;
  BLOCK_SIZE local_191;
  uint local_190;
  uint local_18c;
  BLOCK_SIZE local_186;
  BLOCK_SIZE local_185;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  uint local_178;
  uint local_174;
  loop_filter_info_n *local_170;
  long local_168;
  BLOCK_SIZE local_15a;
  BLOCK_SIZE local_159;
  uint local_158;
  uint local_154;
  BLOCK_SIZE local_14e;
  BLOCK_SIZE local_14d;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  uint local_140;
  uint local_13c;
  BLOCK_SIZE *local_138;
  long local_130;
  BLOCK_SIZE local_125;
  uint local_124;
  long local_120;
  uint local_118;
  byte local_112;
  byte local_111;
  uint local_110;
  uint local_10c;
  SequenceHeader *local_108;
  bool local_fa;
  BLOCK_SIZE local_f9;
  SequenceHeader *local_f8;
  undefined8 *local_f0;
  int local_e4;
  uint *local_e0;
  long local_d8;
  byte local_ce;
  byte local_cd;
  uint local_cc;
  long local_c8;
  uint local_bc;
  uint local_b8;
  undefined1 local_b1;
  long local_b0;
  long local_a8;
  BLOCK_SIZE *local_a0;
  undefined1 *local_98;
  byte local_89;
  uint local_88;
  uint local_84;
  BLOCK_SIZE local_7e;
  byte local_7d;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  uint local_70;
  uint local_6c;
  SequenceHeader *local_68;
  long local_60;
  byte local_52;
  BLOCK_SIZE local_51;
  uint local_50;
  uint local_4c;
  BLOCK_SIZE local_46;
  BLOCK_SIZE local_45;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  uint local_38;
  uint local_34;
  BLOCK_SIZE *local_30;
  long local_28;
  BLOCK_SIZE local_19;
  
  local_2d8 = *(undefined8 *)(in_RDX + 0x10);
  local_2dc = *(undefined4 *)(in_RDX + 0x28);
  local_2e0 = *(int *)(in_RDX + 0x20) + 3 >> 2;
  local_2e4 = *(int *)(in_RDX + 0x24) + 3 >> 2;
  if (local_2e4 - in_ECX < 1 << (in_stack_00000010 & 0x1f)) {
    local_33c = local_2e4 - in_ECX;
  }
  else {
    local_33c = 1 << (in_stack_00000010 & 0x1f);
  }
  local_2e8 = local_33c;
  if ((int)(local_2e0 - in_R8D) < 0x20) {
    local_340 = local_2e0 - in_R8D;
  }
  else {
    local_340 = 0x20;
  }
  local_2ec = local_340;
  local_2f8 = 1;
  local_2d0 = in_R9;
  local_2c8 = in_R8D;
  local_2c4 = in_ECX;
  local_2c0 = in_RDX;
  local_2b8 = in_RSI;
  local_2b0 = in_RDI;
  for (local_2fc = 0; (int)local_2fc < local_2e8; local_2fc = local_2fc + 1) {
    local_300 = local_2c4 + local_2fc;
    local_304 = local_2c8;
    local_308 = local_2c8 + local_2ec;
    local_30c = 0x80;
    local_238 = local_2d0;
    local_248 = local_2b0;
    local_250 = local_2b8;
    local_251 = '\0';
    local_258 = local_2c8;
    local_268 = local_2c0;
    local_278 = 1;
    local_280 = &local_30c;
    local_284 = 1;
    local_290 = local_2d0;
    local_298 = in_stack_00000008;
    local_2a0 = &local_258;
    local_2a1 = 0xff;
    local_cc = local_2c8;
    local_98 = local_2d0;
    local_a0 = in_stack_00000008;
    local_a8 = local_2b0;
    local_b0 = local_2b8;
    local_b1 = 0;
    local_b8 = local_2c8;
    local_c8 = local_2c0;
    local_cd = 1;
    local_ce = 0xff;
    local_d8 = 1;
    local_e4 = 1;
    *local_2d0 = 0;
    local_f0 = (undefined8 *)
               (*(long *)(local_2b0 + 0x238) + (ulong)(local_300 * *(int *)(local_2b0 + 0x244)) * 8
               + (ulong)local_2c8 * 8);
    local_f8 = (SequenceHeader *)*local_f0;
    local_30 = (BLOCK_SIZE *)*local_f0;
    local_28 = local_2b8;
    local_38 = local_2c8;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_26c = local_308;
    local_25c = local_300;
    local_e0 = local_280;
    local_bc = local_300;
    local_34 = local_300;
    if ((local_2b8 == 0) ||
       (*(int *)(local_2b8 + 0x29c4 + (ulong)((byte)*(undefined2 *)(local_30 + 0xa7) & 7) * 4) == 0)
       ) {
      local_45 = local_30[0x91];
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
      local_b1 = 0;
      local_cd = 1;
      local_ce = 0xff;
      local_d8 = 1;
      local_e4 = 1;
      local_251 = '\0';
      local_278 = 1;
      local_284 = 1;
      local_2a1 = 0xff;
      local_30c = 0x80;
      iVar5 = is_inter_block((MB_MODE_INFO *)
                             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      if ((iVar5 != 0) && (local_30[0x90] == BLOCK_4X4)) {
        local_46 = *local_30;
        local_4c = local_34 &
                   "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [local_46] - 1;
        local_50 = local_38 &
                   "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [local_46] - 1;
        in_stack_fffffffffffffca8 = local_30;
        iVar5 = av1_get_txb_size_index(local_46,local_4c,local_50);
        local_51 = in_stack_fffffffffffffca8[(long)iVar5 + 0x92];
        local_45 = local_51;
      }
      local_19 = local_45;
    }
    else {
      local_19 = BLOCK_4X4;
    }
    local_f9 = local_19;
    local_fa = false;
    if (((local_cd & 1) == 0) || (local_cc != 0)) {
      local_108 = (SequenceHeader *)local_f0[-local_d8];
      if (local_e4 == 0) {
        in_stack_fffffffffffffca4 = local_bc - 1;
        local_360 = local_b8;
      }
      else {
        local_360 = local_b8 - 1;
        in_stack_fffffffffffffca4 = local_bc;
      }
      local_110 = local_360;
      local_10c = in_stack_fffffffffffffca4;
      bVar1 = local_ce;
      if ((local_cd & 1) != 0) {
        local_60 = local_b0;
        local_70 = local_360;
        local_74 = 0;
        local_78 = 0;
        local_7c = 0;
        local_6c = in_stack_fffffffffffffca4;
        local_68 = local_108;
        if ((local_b0 == 0) ||
           (*(int *)(local_b0 + 0x29c4 +
                    (ulong)((byte)*(undefined2 *)((long)local_108->operating_point_idc + 0x33) & 7)
                    * 4) == 0)) {
          local_7d = *(byte *)((long)local_108->operating_point_idc + 0x1d);
          in_stack_fffffffffffffc9c = (uint)local_7d;
          local_74 = 0;
          local_78 = 0;
          local_7c = 0;
          local_fa = false;
          iVar5 = is_inter_block((MB_MODE_INFO *)
                                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          if ((iVar5 != 0) && ((char)local_68->operating_point_idc[7] == '\0')) {
            local_7e = (BLOCK_SIZE)local_68->num_bits_width;
            local_84 = local_6c &
                       "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [local_7e] - 1;
            local_88 = local_70 &
                       "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [local_7e] - 1;
            in_stack_fffffffffffffc90 = local_68;
            iVar5 = av1_get_txb_size_index(local_7e,local_84,local_88);
            local_89 = *(byte *)((long)in_stack_fffffffffffffc90->operating_point_idc +
                                (long)iVar5 + 0x1e);
            local_7d = local_89;
          }
          local_52 = local_7d;
          bVar1 = local_7d;
        }
        else {
          local_52 = 0;
          bVar1 = local_52;
        }
      }
      local_111 = bVar1;
      in_stack_fffffffffffffc8c = 0;
      if ((local_cd & 1) != 0) {
        if (local_e4 == 0) {
          bVar1 = block_size_wide[(byte)local_108->num_bits_width];
        }
        else {
          bVar1 = block_size_high[(byte)local_108->num_bits_width];
        }
        local_378 = (uint)bVar1;
        *local_e0 = local_378;
      }
      local_112 = get_filter_level((AV1_COMMON *)
                                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                   in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                                   in_stack_fffffffffffffc48,
                                   (MB_MODE_INFO *)
                                   CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
      if (local_112 == 0) {
        local_112 = get_filter_level((AV1_COMMON *)
                                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                     in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                                     in_stack_fffffffffffffc48,
                                     (MB_MODE_INFO *)
                                     CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
      }
      local_118 = (uint)(local_108 != local_f8);
      if (local_118 == 0) {
        local_379 = false;
        if ((char)local_f8->operating_point_idc[7] != '\0') {
          iVar5 = is_inter_block((MB_MODE_INFO *)
                                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          local_379 = iVar5 != 0;
        }
        local_fa = local_379;
      }
      if (((local_118 != 0) || ((local_fa & 1U) == 0)) && (local_112 != 0)) {
        if (local_e4 == 0) {
          local_380 = (undefined1)horz_filter_length_luma[local_f9][local_111];
        }
        else {
          local_380 = (undefined1)vert_filter_length_luma[local_f9][local_111];
        }
        *local_98 = local_380;
        local_120 = local_a8 + 0x4af0 + (long)(int)(uint)local_112 * 0x30;
        *(long *)(local_98 + 8) = local_120;
      }
    }
    if (local_e4 == 0) {
      bVar1 = block_size_wide[(byte)local_f8->num_bits_width];
    }
    else {
      bVar1 = block_size_high[(byte)local_f8->num_bits_width];
    }
    local_384 = (uint)bVar1;
    local_124 = local_384;
    if ((int)*local_e0 < (int)local_384) {
      local_388 = *local_e0;
    }
    else {
      local_388 = local_384;
    }
    *local_e0 = local_388;
    *local_a0 = local_f9;
    if (local_284 == 0) {
      local_38c = tx_size_high_unit[*local_298];
    }
    else {
      local_38c = tx_size_wide_unit[*local_298];
    }
    local_2a8 = local_38c;
    local_2a1 = *local_298;
    *local_2a0 = local_38c + *local_2a0;
    local_290 = local_290 + (long)local_38c * 0x10;
    local_298 = local_298 + local_38c;
    while (*local_2a0 < local_26c) {
      local_1d4 = *local_2a0;
      local_1a0 = local_290;
      local_1a8 = local_298;
      local_1b0 = local_248;
      local_1b8 = local_250;
      local_1b9 = local_251;
      local_1c0 = local_258;
      local_1c4 = local_25c;
      local_1d0 = local_268;
      local_1d5 = 0;
      local_1d6 = local_2a1;
      local_1e0 = local_278;
      local_1e8 = local_280;
      local_1ec = (uint)(local_251 == '\0');
      *local_290 = 0;
      local_1f8 = (undefined8 *)
                  (*(long *)(local_248 + 0x238) +
                   (ulong)(local_25c * *(int *)(local_248 + 0x244)) * 8 + (ulong)local_258 * 8);
      local_200 = (loop_filter_info_n *)*local_1f8;
      local_138 = (BLOCK_SIZE *)*local_1f8;
      local_130 = local_250;
      local_13c = local_25c;
      local_140 = local_258;
      local_144 = 0;
      local_148 = 0;
      local_14c = 0;
      if ((local_250 == 0) ||
         (*(int *)(local_250 + 0x29c4 + (ulong)((byte)*(undefined2 *)(local_138 + 0xa7) & 7) * 4) ==
          0)) {
        local_14d = local_138[0x91];
        local_144 = 0;
        local_148 = 0;
        local_14c = 0;
        local_1d5 = 0;
        iVar5 = is_inter_block((MB_MODE_INFO *)
                               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        pBVar3 = local_138;
        if ((iVar5 != 0) && (local_138[0x90] == BLOCK_4X4)) {
          local_14e = *local_138;
          local_154 = local_13c &
                      "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [local_14e] - 1;
          local_158 = local_140 &
                      "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [local_14e] - 1;
          iVar5 = av1_get_txb_size_index(local_14e,local_154,local_158);
          local_159 = pBVar3[(long)iVar5 + 0x92];
          local_14d = local_159;
        }
        local_125 = local_14d;
      }
      else {
        local_125 = BLOCK_4X4;
      }
      local_201 = local_125;
      local_202 = 0;
      if (((local_1d5 & 1) == 0) || (local_1d4 != 0)) {
        local_210 = (loop_filter_info_n *)local_1f8[-local_1e0];
        if (local_1ec == 0) {
          local_39c = local_1c4 - 1;
        }
        else {
          local_39c = local_1c4;
        }
        local_214 = local_39c;
        if (local_1ec == 0) {
          local_3a0 = local_1c0;
        }
        else {
          local_3a0 = local_1c0 - 1;
        }
        local_218 = local_3a0;
        BVar4 = local_1d6;
        if ((local_1d5 & 1) != 0) {
          local_168 = local_1b8;
          local_174 = local_39c;
          local_178 = local_3a0;
          local_17c = 0;
          local_180 = 0;
          local_184 = 0;
          local_170 = local_210;
          if ((local_1b8 == 0) ||
             (*(int *)(local_1b8 + 0x29c4 +
                      (ulong)((byte)*(undefined2 *)(local_210->lfthr[3].lim + 7) & 7) * 4) == 0)) {
            local_185 = local_210->lfthr[3].mblim[1];
            local_17c = 0;
            local_180 = 0;
            local_184 = 0;
            local_202 = 0;
            in_stack_fffffffffffffc5c = (uint)local_185;
            iVar5 = is_inter_block((MB_MODE_INFO *)
                                   CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
            if ((iVar5 != 0) && (local_170->lfthr[3].mblim[0] == '\0')) {
              local_186 = local_170->lfthr[0].mblim[0];
              local_18c = local_174 &
                          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [local_186] - 1;
              local_190 = local_178 &
                          "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [local_186] - 1;
              in_stack_fffffffffffffc50 = local_170;
              iVar5 = av1_get_txb_size_index(local_186,local_18c,local_190);
              local_191 = in_stack_fffffffffffffc50->lfthr[3].mblim[(long)iVar5 + 2];
              local_185 = local_191;
            }
            local_15a = local_185;
            BVar4 = local_185;
          }
          else {
            local_15a = BLOCK_4X4;
            BVar4 = local_15a;
          }
        }
        local_219 = BVar4;
        in_stack_fffffffffffffc4c = (uint)local_219;
        if ((local_1d5 & 1) != 0) {
          if (local_1ec == 0) {
            bVar1 = block_size_wide[local_210->lfthr[0].mblim[0]];
          }
          else {
            bVar1 = block_size_high[local_210->lfthr[0].mblim[0]];
          }
          in_stack_fffffffffffffc48 = (uint)bVar1;
          *local_1e8 = in_stack_fffffffffffffc48;
        }
        local_21a = get_filter_level((AV1_COMMON *)
                                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                     in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                                     in_stack_fffffffffffffc48,
                                     (MB_MODE_INFO *)
                                     CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
        if (local_21a == 0) {
          local_21a = get_filter_level((AV1_COMMON *)
                                       CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                                       ,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                                       in_stack_fffffffffffffc48,
                                       (MB_MODE_INFO *)
                                       CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40)
                                      );
        }
        local_220 = (uint)(local_210 != local_200);
        if (local_220 == 0) {
          in_stack_fffffffffffffc44 = in_stack_fffffffffffffc44 & 0xffffff;
          if (local_200->lfthr[3].mblim[0] != '\0') {
            iVar5 = is_inter_block((MB_MODE_INFO *)
                                   CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
            in_stack_fffffffffffffc44 = CONCAT13(iVar5 != 0,(int3)in_stack_fffffffffffffc44);
          }
          local_202 = (byte)(in_stack_fffffffffffffc44 >> 0x18);
        }
        if (((local_220 != 0) || ((local_202 & 1) == 0)) && (local_21a != 0)) {
          if (local_1ec == 0) {
            in_stack_fffffffffffffc40 = horz_filter_length_luma[local_201][local_219];
          }
          else {
            in_stack_fffffffffffffc40 = vert_filter_length_luma[local_201][local_219];
          }
          *local_1a0 = (char)in_stack_fffffffffffffc40;
          local_228 = local_1b0 + 0x4af0 + (long)(int)(uint)local_21a * 0x30;
          *(long *)(local_1a0 + 8) = local_228;
        }
      }
      if (local_1ec == 0) {
        bVar1 = block_size_wide[local_200->lfthr[0].mblim[0]];
      }
      else {
        bVar1 = block_size_high[local_200->lfthr[0].mblim[0]];
      }
      local_3c4 = (uint)bVar1;
      local_22c = local_3c4;
      if ((int)*local_1e8 < (int)local_3c4) {
        local_3c8 = *local_1e8;
      }
      else {
        local_3c8 = local_3c4;
      }
      *local_1e8 = local_3c8;
      *local_1a8 = local_201;
      if (local_284 == 0) {
        in_stack_fffffffffffffc34 = tx_size_high_unit[*local_298];
      }
      else {
        in_stack_fffffffffffffc34 = tx_size_wide_unit[*local_298];
      }
      local_2a1 = *local_298;
      *local_2a0 = in_stack_fffffffffffffc34 + *local_2a0;
      local_290 = local_290 + (long)in_stack_fffffffffffffc34 * 0x10;
      local_298 = local_298 + in_stack_fffffffffffffc34;
      local_2a8 = in_stack_fffffffffffffc34;
    }
    local_318 = local_2d0;
    local_320 = in_stack_00000008;
    if ((((local_2fc & 3) == 0) && ((int)(local_2fc + 3) < local_2e8)) && (0xf < (int)local_30c)) {
      local_2fc = local_2fc + 3;
    }
    else if (((int)(local_2fc + 1) < local_2e8) && (7 < (int)local_30c)) {
      local_2fc = local_2fc + 1;
    }
    for (local_334 = 0; local_334 < local_2ec; local_334 = uVar2 + local_334) {
      if (*local_320 == BLOCK_INVALID) {
        *local_318 = 0;
        *local_320 = BLOCK_4X4;
      }
      filter_vert(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                  (AV1_DEBLOCKING_PARAMETERS *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                  in_stack_fffffffffffffc90,
                  (USE_FILTER_TYPE)((uint)in_stack_fffffffffffffc8c >> 0x18));
      uVar2 = tx_size_wide_unit[*local_320];
      local_318 = local_318 + (ulong)uVar2 * 0x10;
      local_320 = local_320 + uVar2;
    }
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  // Whenever 'pipeline_lpf_mt_with_enc' is enabled, height of the unit to
  // filter (i.e., y_range) is calculated based on the size of the superblock
  // used.
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  // Width of the unit to filter (i.e., x_range) should always be calculated
  // based on maximum superblock size as this function is called for mi_col = 0,
  // MAX_MIB_SIZE, 2 * MAX_MIB_SIZE etc.
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);
  const ptrdiff_t mode_step = 1;
  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + y;
    const uint32_t x_start = mi_col;
    const uint32_t x_end = mi_col + x_range;
    int min_block_height = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                     x_start, curr_y, plane_ptr, x_end,
                                     mode_step, &min_block_height);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + y * MI_SIZE * dst_stride;

    if ((y & 3) == 0 && (y + 3) < y_range && min_block_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      use_filter_type = USE_QUAD;
      y += 3;
    } else if ((y + 1) < y_range && min_block_height >= 8) {
      use_filter_type = USE_DUAL;
      y += 1;
    }

    for (int x = 0; x < x_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_vert(p, dst_stride, params, cm->seq_params, use_filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      p += advance_units * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}